

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O1

TestCaseGroup * vkt::pipeline::createVertexInputTests(TestContext *testCtx)

{
  VkFormat VVar1;
  iterator __position;
  void *pvVar2;
  void *pvVar3;
  pointer pAVar4;
  bool bVar5;
  deUint32 dVar6;
  value_type *__val;
  TestNode *this;
  TestNode *pTVar7;
  VertexInputTest *pVVar8;
  pointer pAVar9;
  long lVar10;
  TestNode *pTVar11;
  TestNode *this_00;
  TestNode *this_01;
  ostream *poVar12;
  TestNode *this_02;
  ulong uVar13;
  AttributeInfo *attributeInfo_00;
  AttributeInfo *attributeInfo_01;
  AttributeInfo *attributeInfo_02;
  AttributeInfo *attributeInfo_03;
  VkFormat *__args;
  long lVar14;
  allocator_type *__a;
  AttributeInfo *extraout_RDX;
  AttributeInfo *extraout_RDX_00;
  AttributeInfo *extraout_RDX_01;
  AttributeInfo *extraout_RDX_02;
  AttributeInfo *attributeInfo_04;
  AttributeInfo *attributeInfo_05;
  int glslTypeNdx;
  GlslType glslType;
  value_type *__val_1;
  long lVar15;
  uint uVar16;
  VkVertexInputRate *pVVar17;
  long lVar18;
  pointer this_03;
  AttributeInfo attributeInfo;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  glslTypes;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  attributeInfos;
  string caseName;
  Random randomFunc;
  VkFormat vertexFormats [40];
  ostringstream caseName_1;
  CompatibleFormats compatibleFormats [22];
  GlslTypeCombinationsIterator local_600;
  string local_5b8;
  void *local_598;
  void *local_590;
  long local_588;
  _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  local_580;
  string local_568;
  string local_548;
  deRandom local_528;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  local_518 [7];
  string local_470 [3];
  ios_base local_400 [240];
  long alStack_310 [3];
  undefined1 local_2f8 [8];
  long lStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [43];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"vertex_input","");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,testCtx,"single_attribute","Uses one attribute");
  lVar10 = 0;
  do {
    VVar1 = (&DAT_00b08a50)[lVar10];
    glslType = GLSL_TYPE_INT;
    do {
      bVar5 = anon_unknown_0::VertexInputTest::isCompatibleType(VVar1,glslType);
      if (bVar5) {
        local_600.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        ._vptr_CombinationsIterator = (_func_int **)CONCAT44(VVar1,glslType);
        local_600.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        .m_numItems = VK_VERTEX_INPUT_RATE_VERTEX;
        pVVar8 = (VertexInputTest *)operator_new(0x98);
        (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  ((string *)local_2f8,(_anonymous_namespace_ *)&local_600,attributeInfo_00);
        (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  (local_470,(_anonymous_namespace_ *)&local_600,attributeInfo_01);
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pAVar9 = (pointer)operator_new(0xc);
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pAVar9 + 1;
        pAVar9->inputRate =
             local_600.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_numItems;
        *(_func_int ***)pAVar9 =
             local_600.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             ._vptr_CombinationsIterator;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pAVar9;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_518[0].
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        anon_unknown_0::VertexInputTest::VertexInputTest
                  (pVVar8,testCtx,(string *)local_2f8,local_470,local_518,BINDING_MAPPING_ONE_TO_ONE
                   ,ATTRIBUTE_LAYOUT_INTERLEAVED);
        tcu::TestNode::addChild(pTVar7,(TestNode *)pVVar8);
        operator_delete(pAVar9,0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470[0]._M_dataplus._M_p != &local_470[0].field_2) {
          operator_delete(local_470[0]._M_dataplus._M_p,
                          local_470[0].field_2._M_allocated_capacity + 1);
        }
        if (local_2f8 != (undefined1  [8])local_2e8) {
          operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
        }
        local_600.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        .m_numItems = VK_VERTEX_INPUT_RATE_INSTANCE;
        pVVar8 = (VertexInputTest *)operator_new(0x98);
        (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  ((string *)local_2f8,(_anonymous_namespace_ *)&local_600,attributeInfo_02);
        (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  (local_470,(_anonymous_namespace_ *)&local_600,attributeInfo_03);
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pAVar9 = (pointer)operator_new(0xc);
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pAVar9 + 1;
        pAVar9->inputRate =
             local_600.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_numItems;
        *(_func_int ***)pAVar9 =
             local_600.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             ._vptr_CombinationsIterator;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pAVar9;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_518[0].
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        anon_unknown_0::VertexInputTest::VertexInputTest
                  (pVVar8,testCtx,(string *)local_2f8,local_470,local_518,BINDING_MAPPING_ONE_TO_ONE
                   ,ATTRIBUTE_LAYOUT_INTERLEAVED);
        tcu::TestNode::addChild(pTVar7,(TestNode *)pVVar8);
        operator_delete(pAVar9,0xc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470[0]._M_dataplus._M_p != &local_470[0].field_2) {
          operator_delete(local_470[0]._M_dataplus._M_p,
                          local_470[0].field_2._M_allocated_capacity + 1);
        }
        if (local_2f8 != (undefined1  [8])local_2e8) {
          operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
        }
      }
      glslType = glslType + GLSL_TYPE_IVEC2;
    } while (glslType != GLSL_TYPE_COUNT);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x44);
  tcu::TestNode::addChild(this,pTVar7);
  memcpy(local_518,&DAT_00b08bd0,0xa0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,testCtx,"multiple_attributes","Uses more than one attribute");
  lVar10 = 8;
  do {
    *(undefined8 *)(local_2f8 + lVar10) = 0;
    *(undefined8 *)((long)&lStack_2f0 + lVar10) = 0;
    *(undefined8 *)((long)local_2e8 + lVar10) = 0;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x2c8);
  lVar10 = 0;
  do {
    lVar18 = 0;
    do {
      bVar5 = anon_unknown_0::VertexInputTest::isCompatibleType
                        (*(VkFormat *)
                          ((long)&local_518[0].
                                  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar18),
                         (GlslType)lVar10);
      if (bVar5) {
        __args = (VkFormat *)
                 ((long)&local_518[0].
                         super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar18);
        __position._M_current = *(VkFormat **)(local_2e8 + lVar10 * 2);
        if (__position._M_current == *(VkFormat **)((long)local_2e8 + lVar10 * 0x20 + 8)) {
          std::vector<vk::VkFormat,std::allocator<vk::VkFormat>>::
          _M_realloc_insert<vk::VkFormat_const&>
                    ((vector<vk::VkFormat,std::allocator<vk::VkFormat>> *)(&lStack_2f0 + lVar10 * 4)
                     ,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          local_2e8[lVar10 * 2]._M_allocated_capacity = (size_type)(__position._M_current + 1);
        }
      }
      lVar18 = lVar18 + 4;
    } while (lVar18 != 0xa0);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x16);
  deRandom_init(&local_528,0x18e8e);
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)&PTR__CombinationsIterator_00d55750;
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_numItems = 0xf;
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationSize = 3;
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationCount = 0x1c7;
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_600.
              super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
              .m_combination,3);
  if (local_600.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationSize != 0) {
    uVar13 = 0;
    do {
      local_600.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] = (uint)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (local_600.
                       super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                       ._16_8_ & 0xffffffff));
  }
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationIndex = 0;
  local_600.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)&PTR__GlslTypeCombinationsIterator_00d55700;
  local_600.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_600.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_600.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_600.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xc);
  local_600.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_600.m_combinationValue.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
       ._M_impl.super__Vector_impl_data._M_start + 3;
  *local_600.m_combinationValue.
   super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
   ._M_impl.super__Vector_impl_data._M_start = GLSL_TYPE_INT;
  lVar10 = 4;
  do {
    *(GlslType *)
     ((long)local_600.m_combinationValue.
            super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar10) =
         *local_600.m_combinationValue.
          super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
          ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  local_600.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_600.m_combinationValue.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar11,testCtx,"attributes","");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,"attributes","");
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_01,testCtx,"attributes_sequential","");
  if (local_600.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationIndex <
      local_600.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationCount) {
    do {
      if (local_600.
          super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
          .m_combinationIndex != 0) {
        if (-1 < (int)(local_600.
                       super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                       .m_combinationSize - 1)) {
          lVar18 = (local_600.
                    super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                    ._16_8_ & 0xffffffff) << 0x20;
          lVar15 = 0;
          lVar10 = (ulong)(local_600.
                           super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                           .m_combinationSize - 1) + 1;
          do {
            uVar16 = local_600.
                     super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                     .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar10 + -1] + 1;
            if ((uVar16 < local_600.
                          super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                          .m_numItems) &&
               (((int)lVar15 == 0 ||
                (uVar16 < *(uint *)((long)local_600.
                                          super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                                          .m_combination.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                   (lVar18 >> 0x1e)))))) {
              local_600.
              super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
              .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[lVar10 + -1] = uVar16;
              uVar13 = (local_600.
                        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                        ._16_8_ & 0xffffffff) - lVar15;
              if ((uint)uVar13 <
                  local_600.
                  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                  .m_combinationSize) {
                do {
                  local_600.
                  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar13] =
                       local_600.
                       super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                       .m_combination.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar13 - 1] + 1;
                  uVar13 = uVar13 + 1;
                } while (uVar13 < (local_600.
                                   super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                                   ._16_8_ & 0xffffffff));
              }
              break;
            }
            lVar15 = lVar15 + 1;
            lVar18 = lVar18 + -0x100000000;
            lVar14 = lVar10 + -1;
            bVar5 = 0 < lVar10;
            lVar10 = lVar14;
          } while (lVar14 != 0 && bVar5);
        }
      }
      local_600.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationIndex =
           local_600.
           super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
           .m_combinationIndex + 1;
      (*local_600.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        ._vptr_CombinationsIterator[2])
                (&local_598,&local_600,
                 &local_600.
                  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                  .m_combination);
      pvVar3 = local_590;
      pvVar2 = local_598;
      uVar13 = (long)local_590 - (long)local_598 >> 2;
      if (0xaaaaaaaaaaaaaaa < uVar13) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      std::
      _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
      ::_Vector_base(&local_580,uVar13,__a);
      pAVar4 = local_580._M_impl.super__Vector_impl_data._M_start;
      pAVar9 = local_580._M_impl.super__Vector_impl_data._M_start;
      if (pvVar3 != pvVar2) {
        (local_580._M_impl.super__Vector_impl_data._M_start)->inputRate =
             VK_VERTEX_INPUT_RATE_VERTEX;
        (local_580._M_impl.super__Vector_impl_data._M_start)->glslType = GLSL_TYPE_INT;
        (local_580._M_impl.super__Vector_impl_data._M_start)->vkType = VK_FORMAT_UNDEFINED;
        if (uVar13 - 1 == 0) {
          pAVar9 = local_580._M_impl.super__Vector_impl_data._M_start + 1;
        }
        else {
          pAVar9 = local_580._M_impl.super__Vector_impl_data._M_start + uVar13;
          if ((uVar13 - 1) * 0xc != 0) {
            lVar10 = 0xc;
            do {
              *(VkVertexInputRate *)
               ((long)&(local_580._M_impl.super__Vector_impl_data._M_start)->inputRate + lVar10) =
                   (local_580._M_impl.super__Vector_impl_data._M_start)->inputRate;
              *(undefined8 *)
               ((long)&(local_580._M_impl.super__Vector_impl_data._M_start)->glslType + lVar10) =
                   *(undefined8 *)local_580._M_impl.super__Vector_impl_data._M_start;
              lVar10 = lVar10 + 0xc;
            } while (uVar13 * 0xc != lVar10);
          }
        }
      }
      lVar10 = ((long)pAVar9 - (long)local_580._M_impl.super__Vector_impl_data._M_start >> 2) *
               -0x5555555555555555;
      local_580._M_impl.super__Vector_impl_data._M_finish = pAVar9;
      if (pAVar9 != local_580._M_impl.super__Vector_impl_data._M_start) {
        pVVar17 = &(local_580._M_impl.super__Vector_impl_data._M_start)->inputRate;
        lVar18 = 0;
        do {
          uVar13 = (ulong)*(uint *)((long)local_598 + lVar18 * 4);
          dVar6 = deRandom_getUint32(&local_528);
          VVar1 = *(VkFormat *)
                   ((&lStack_2f0)[uVar13 * 4] +
                   ((ulong)dVar6 %
                   (ulong)((long)(local_2e8[uVar13 * 2]._M_allocated_capacity -
                                 (&lStack_2f0)[uVar13 * 4]) >> 2)) * 4);
          ((AttributeInfo *)(pVVar17 + -2))->glslType = *(GlslType *)((long)local_598 + lVar18 * 4);
          *pVVar17 = (VkVertexInputRate)lVar18 & VK_VERTEX_INPUT_RATE_INSTANCE;
          pVVar17[-1] = VVar1;
          lVar18 = lVar18 + 1;
          pVVar17 = pVVar17 + 3;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar18);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
      if (pAVar9 != pAVar4) {
        uVar13 = 0;
        attributeInfo_04 = extraout_RDX;
        this_03 = pAVar4;
        do {
          (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                    (&local_5b8,(_anonymous_namespace_ *)this_03,attributeInfo_04);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_470,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
          attributeInfo_04 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
            attributeInfo_04 = extraout_RDX_01;
          }
          if (uVar13 < lVar10 - 1U) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"-",1);
            attributeInfo_04 = extraout_RDX_02;
          }
          uVar13 = uVar13 + 1;
          this_03 = this_03 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != uVar13);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      std::ios_base::~ios_base(local_400);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_470,"Uses vertex attributes:\n",0x18);
      if (pAVar9 != pAVar4) {
        lVar10 = lVar10 + (ulong)(lVar10 == 0);
        pAVar9 = pAVar4;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"\t- ",3);
          (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                    (&local_5b8,(_anonymous_namespace_ *)pAVar9,attributeInfo_05);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_470,local_5b8._M_dataplus._M_p,
                               local_5b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
            operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
          }
          pAVar9 = pAVar9 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      std::ios_base::~ios_base(local_400);
      pVVar8 = (VertexInputTest *)operator_new(0x98);
      anon_unknown_0::VertexInputTest::VertexInputTest
                (pVVar8,testCtx,&local_548,&local_568,
                 (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)&local_580,BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
      tcu::TestNode::addChild(pTVar11,(TestNode *)pVVar8);
      pVVar8 = (VertexInputTest *)operator_new(0x98);
      anon_unknown_0::VertexInputTest::VertexInputTest
                (pVVar8,testCtx,&local_548,&local_568,
                 (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)&local_580,BINDING_MAPPING_ONE_TO_MANY,ATTRIBUTE_LAYOUT_INTERLEAVED);
      tcu::TestNode::addChild(this_00,(TestNode *)pVVar8);
      pVVar8 = (VertexInputTest *)operator_new(0x98);
      anon_unknown_0::VertexInputTest::VertexInputTest
                (pVVar8,testCtx,&local_548,&local_568,
                 (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)&local_580,BINDING_MAPPING_ONE_TO_MANY,ATTRIBUTE_LAYOUT_SEQUENTIAL);
      tcu::TestNode::addChild(this_01,(TestNode *)pVVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
      }
      if (pAVar4 != (pointer)0x0) {
        operator_delete(pAVar4,(long)local_580._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pAVar4);
      }
      if (local_598 != (void *)0x0) {
        operator_delete(local_598,local_588 - (long)local_598);
      }
    } while (local_600.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_combinationIndex <
             local_600.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_combinationCount);
  }
  this_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_02,testCtx,"binding_one_to_one",
             "Each attribute uses a unique binding");
  tcu::TestNode::addChild(this_02,pTVar11);
  tcu::TestNode::addChild(pTVar7,this_02);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,testCtx,"binding_one_to_many",
             "Attributes share the same binding");
  tcu::TestNode::addChild(pTVar11,this_00);
  tcu::TestNode::addChild(pTVar11,this_01);
  tcu::TestNode::addChild(pTVar7,pTVar11);
  anon_unknown_0::GlslTypeCombinationsIterator::~GlslTypeCombinationsIterator(&local_600);
  lVar10 = 0x2c0;
  do {
    pvVar2 = *(void **)((long)alStack_310 + lVar10);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)alStack_310 + lVar10 + 0x10) - (long)pvVar2);
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != 0);
  tcu::TestNode::addChild(this,pTVar7);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createVertexInputTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	vertexInputTests (new tcu::TestCaseGroup(testCtx, "vertex_input", ""));

	vertexInputTests->addChild(createSingleAttributeTests(testCtx).release());
	vertexInputTests->addChild(createMultipleAttributeTests(testCtx).release());

	return vertexInputTests.release();
}